

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dac_control.c
# Opt level: O3

void daccontrol_update(void *info,UINT32 samples,DEV_SMPL **dummy)

{
  char cVar1;
  undefined1 uVar2;
  long lVar3;
  uint uVar4;
  ushort uVar5;
  uint6 uVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  code *pcVar10;
  byte bVar11;
  int iVar12;
  ushort uVar13;
  dac_control *chip;
  undefined8 uVar14;
  uint uVar15;
  ulong uVar16;
  byte bVar17;
  ulong local_38;
  
  if ((*(byte *)((long)info + 0x7c) & 0x81) != 1) {
    return;
  }
  uVar4 = -(uint)*(byte *)((long)info + 0x98);
  if (*(char *)((long)info + 0x7d) == '\0') {
    uVar4 = (uint)*(byte *)((long)info + 0x98);
  }
  uVar16 = (ulong)samples * *(long *)((long)info + 0x80) + *(long *)((long)info + 0x88);
  *(ulong *)((long)info + 0x88) = uVar16 & 0xffffffff;
  uVar9 = *(uint *)((long)info + 0x90);
  uVar15 = (uint)(uVar16 >> 0x20);
  if (uVar9 < uVar15) {
    uVar15 = uVar9;
  }
  iVar8 = uVar9 - uVar15;
  *(int *)((long)info + 0x90) = iVar8;
  if (uVar15 < 0x21) {
    if (uVar15 == 0) goto LAB_0011f3fc;
  }
  else {
    *(int *)((long)info + 0x94) = *(int *)((long)info + 0x94) + (uVar15 - 0x10) * uVar4;
    uVar15 = 0x10;
  }
  iVar8 = *(int *)((long)info + 0x94);
  do {
    uVar9 = iVar8 + *(int *)((long)info + 0x70);
    if (uVar9 < *(uint *)((long)info + 0x60)) {
      lVar3 = *(long *)((long)info + 0x68);
      uVar16 = (ulong)uVar9;
      cVar1 = *(char *)((long)info + 0x50);
      switch(cVar1) {
      case '\0':
        pcVar10 = *(code **)((long)info + 0x30);
        if (pcVar10 != (code *)0x0) {
          bVar11 = (byte)*(ushort *)((long)info + 0x52) & 0xf0;
          bVar7 = *(byte *)(lVar3 + uVar16) & 0xf;
          if ((*(ushort *)((long)info + 0x52) & 0x10) == 0) {
            bVar17 = *(byte *)(lVar3 + uVar16) >> 4 | (*(byte *)(lVar3 + 1 + uVar16) & 3) << 4;
            (*pcVar10)(*(undefined8 *)((long)info + 8),0,bVar7 | bVar11);
            uVar14 = *(undefined8 *)((long)info + 8);
            goto LAB_0011f3e5;
          }
          uVar14 = *(undefined8 *)((long)info + 8);
          bVar7 = bVar7 | bVar11;
LAB_0011f3cc:
          uVar13 = 0;
LAB_0011f3ce:
          (*pcVar10)(uVar14,uVar13,bVar7);
        }
        break;
      case '\x01':
      case '\x03':
      case '\x06':
      case '\t':
      case '\n':
      case '\v':
      case '\x0f':
      case '\x12':
        if (*(code **)((long)info + 0x30) != (code *)0x0) {
          uVar16 = (ulong)*(byte *)(lVar3 + uVar16);
          (**(code **)((long)info + 0x30))
                    (*(undefined8 *)((long)info + 8),0,*(undefined1 *)((long)info + 0x52));
          uVar14 = *(undefined8 *)((long)info + 8);
          uVar13 = 1;
LAB_0011f182:
          (**(code **)((long)info + 0x30))(uVar14,uVar13,uVar16);
        }
        break;
      case '\x02':
      case '\a':
      case '\b':
      case '\f':
      case '\r':
      case '\x0e':
      case '\x19':
        if (*(code **)((long)info + 0x30) != (code *)0x0) {
          uVar16 = (ulong)*(byte *)(lVar3 + uVar16);
          uVar13 = *(ushort *)((long)info + 0x52) >> 7;
          (**(code **)((long)info + 0x30))
                    (*(undefined8 *)((long)info + 8),uVar13 & 0xfe,
                     (char)*(ushort *)((long)info + 0x52));
          uVar14 = *(undefined8 *)((long)info + 8);
          uVar13 = (ushort)(byte)((byte)uVar13 | 1);
          goto LAB_0011f182;
        }
        break;
      case '\x04':
      case '\x10':
      case '\x15':
      case '%':
        break;
      case '\x05':
      case '\x1b':
        pcVar10 = *(code **)((long)info + 0x30);
        if (pcVar10 != (code *)0x0) {
          uVar13 = *(ushort *)((long)info + 0x52);
          uVar5 = uVar13 >> 8;
          uVar2 = *(undefined1 *)(lVar3 + uVar16);
          if (uVar5 == 0xff) {
            (*pcVar10)(*(undefined8 *)((long)info + 8),uVar13 & 0xf,uVar2);
          }
          else {
            bVar7 = (byte)(uVar13 >> 8);
            if (cVar1 == '\x1b') {
              bVar7 = (**(code **)((long)info + 0x10))(*(undefined8 *)((long)info + 8),0);
              pcVar10 = *(code **)((long)info + 0x30);
            }
            local_38._0_4_ = (uint)bVar7;
            uVar6 = CONCAT24(uVar13 >> 4,(uint)local_38) & 0xfffffffff;
            local_38 = (ulong)uVar6;
            uVar16 = local_38;
            (*pcVar10)(*(undefined8 *)((long)info + 8),uVar13 >> 4 & 0xf,uVar5);
            (**(code **)((long)info + 0x30))(*(undefined8 *)((long)info + 8),uVar13 & 0xf,uVar2);
            local_38._0_1_ = (byte)uVar6;
            uVar16 = uVar16 & 0xff;
            if (uVar5 != (byte)local_38) {
              uVar14 = *(undefined8 *)((long)info + 8);
              uVar13 = (ushort)(uVar6 >> 0x20);
              goto LAB_0011f182;
            }
          }
        }
        break;
      case '\x11':
        pcVar10 = *(code **)((long)info + 0x38);
        if (pcVar10 != (code *)0x0) {
          uVar9 = (uint)*(byte *)(lVar3 + uVar16) | (*(byte *)(lVar3 + 1 + uVar16) & 0xf) << 8;
          uVar14 = *(undefined8 *)((long)info + 8);
          uVar13 = *(ushort *)((long)info + 0x52) & 0xf;
LAB_0011f1dd:
          (*pcVar10)(uVar14,uVar13,uVar9);
        }
        break;
      case '\x13':
      case '\x14':
      case '\x16':
      case '\x17':
      case '\x1d':
      case '\x1e':
      case '$':
      case '(':
      case ')':
        pcVar10 = *(code **)((long)info + 0x30);
        if (pcVar10 != (code *)0x0) {
          uVar13 = (ushort)*(byte *)((long)info + 0x52);
          uVar9 = (uint)*(byte *)(lVar3 + uVar16);
          uVar14 = *(undefined8 *)((long)info + 8);
          goto LAB_0011f1dd;
        }
        break;
      case '\x18':
        pcVar10 = *(code **)((long)info + 0x30);
        if (pcVar10 != (code *)0x0) {
          uVar13 = *(ushort *)((long)info + 0x52);
          bVar7 = *(byte *)(lVar3 + uVar16);
          if ((char)uVar13 != '\0') {
            uVar14 = *(undefined8 *)((long)info + 8);
            uVar13 = uVar13 & 0xff;
            goto LAB_0011f3ce;
          }
          uVar14 = *(undefined8 *)((long)info + 8);
          bVar17 = (byte)(uVar13 >> 8);
          if (-1 < (char)bVar7) {
            bVar7 = (bVar17 & 0xf) << 3;
            goto LAB_0011f3cc;
          }
          (*pcVar10)(uVar14,0,bVar7);
          uVar14 = *(undefined8 *)((long)info + 8);
          bVar17 = bVar17 << 4;
LAB_0011f3e5:
          (**(code **)((long)info + 0x30))(uVar14,0,bVar17);
        }
        break;
      case '\x1a':
      case '\x1c':
      case ' ':
      case '\"':
      case '&':
      case '\'':
switchD_0011f0f4_caseD_1a:
        pcVar10 = *(code **)((long)info + 0x40);
        if (pcVar10 != (code *)0x0) {
          uVar9 = (uint)*(byte *)(lVar3 + uVar16);
          uVar14 = *(undefined8 *)((long)info + 8);
          uVar13 = *(ushort *)((long)info + 0x52);
          goto LAB_0011f1dd;
        }
        break;
      case '\x1f':
        if (*(code **)((long)info + 0x30) != (code *)0x0) {
          bVar7 = *(byte *)((long)info + 0x52);
          (**(code **)((long)info + 0x30))
                    (*(undefined8 *)((long)info + 8),0,*(undefined1 *)(lVar3 + uVar16));
          (**(code **)((long)info + 0x30))
                    (*(undefined8 *)((long)info + 8),1,*(undefined1 *)(lVar3 + 1 + uVar16));
          uVar14 = *(undefined8 *)((long)info + 8);
          uVar13 = 2;
          uVar16 = (ulong)bVar7;
          goto LAB_0011f182;
        }
        break;
      case '!':
        pcVar10 = *(code **)((long)info + 0x30);
        if (pcVar10 != (code *)0x0) {
          uVar9 = (uint)*(byte *)(lVar3 + uVar16);
          uVar14 = *(undefined8 *)((long)info + 8);
          uVar13 = (ushort)(byte)(*(char *)((long)info + 0x52) + 0x80);
          goto LAB_0011f1dd;
        }
        break;
      case '#':
        if (*(code **)((long)info + 0x30) != (code *)0x0) {
          uVar16 = (ulong)*(byte *)(lVar3 + uVar16);
          (**(code **)((long)info + 0x30))
                    (*(undefined8 *)((long)info + 8),1,*(undefined1 *)((long)info + 0x52));
          uVar14 = *(undefined8 *)((long)info + 8);
          uVar13 = 0;
          goto LAB_0011f182;
        }
        break;
      default:
        if (cVar1 == -0x80) goto switchD_0011f0f4_caseD_1a;
      }
    }
    iVar8 = *(int *)((long)info + 0x94) + uVar4;
    *(int *)((long)info + 0x94) = iVar8;
    uVar15 = uVar15 - 1;
  } while (uVar15 != 0);
  iVar8 = *(int *)((long)info + 0x90);
LAB_0011f3fc:
  if (iVar8 == 0) {
    if ((*(byte *)((long)info + 0x7c) & 4) != 0) {
      iVar8 = *(int *)((long)info + 0x78);
      *(int *)((long)info + 0x90) = iVar8;
      if (*(char *)((long)info + 0x7d) == '\0') {
        iVar12 = 0;
      }
      else {
        iVar12 = (uint)*(byte *)((long)info + 0x98) * (iVar8 + -1);
      }
      *(int *)((long)info + 0x94) = iVar12;
      if (iVar8 != 0) {
        return;
      }
    }
    *(byte *)((long)info + 0x7c) = *(byte *)((long)info + 0x7c) & 0xfe;
  }
  return;
}

Assistant:

void daccontrol_update(void* info, UINT32 samples, DEV_SMPL** dummy)
{
	dac_control* chip = (dac_control*)info;
	INT32 RealDataStp;
	UINT32 cmdsToProc;
	
	if (chip->Running & 0x80)	// disabled
		return;
	if (! (chip->Running & 0x01))	// stopped
		return;
	
	RealDataStp = (chip->Reverse) ? -chip->DataStep : +chip->DataStep;
	
	RC_STEPS(&chip->stepCntr, samples);
	cmdsToProc = RC_GET_VAL(&chip->stepCntr);
	RC_MASK(&chip->stepCntr);
	
	if (cmdsToProc > chip->RemainCmds)
		cmdsToProc = chip->RemainCmds;
	chip->RemainCmds -= cmdsToProc;
	
	if (cmdsToProc > 0x20)
	{
		// very effective Speed Hack for fast seeking
		chip->RealPos += RealDataStp * (cmdsToProc - 0x10);
		cmdsToProc = 0x10;
	}
	
	for (; cmdsToProc > 0; cmdsToProc --)
	{
		daccontrol_SendCommand(chip);
		chip->RealPos += RealDataStp;
	}
	
	if (! chip->RemainCmds && (chip->Running & 0x04))
	{
		// loop back to start
		chip->RemainCmds = chip->CmdsToSend;
		if (! chip->Reverse)
			chip->RealPos = 0x00;
		else
			chip->RealPos = (chip->CmdsToSend - 1) * chip->DataStep;
	}
	
	if (! chip->RemainCmds)
		chip->Running &= ~0x01;	// stop
	
	return;
}